

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofFieldMultipleIdenticalDescriptorTest_Test::
~NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofFieldMultipleIdenticalDescriptorTest_Test
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofFieldMultipleIdenticalDescriptorTest_Test
           *this)

{
  (this->super_NoFieldPresenceSwapFieldTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceSwapFieldTest_0190ebd0;
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x590);
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest,
       ReflectionSwapFieldOneofFieldMultipleIdenticalDescriptorTest) {
  m1_.set_oneof_uint32(1);
  m2_.set_oneof_string("test");

  // NOTE: Calling swap on any field descriptor within the oneof works --
  // even a completely unrelated field.
  const FieldDescriptor* never_set_field = d1_->FindFieldByName("oneof_enum");
  const FieldDescriptor* f1 = d1_->FindFieldByName("oneof_uint32");
  const FieldDescriptor* f2 = d2_->FindFieldByName("oneof_string");

  // Multiple instances of the identical descriptor is ignored.
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{never_set_field, never_set_field});

  // Fields should be swapped (just once).
  EXPECT_EQ(m1_.oneof_string(), "test");
  EXPECT_EQ(m2_.oneof_uint32(), 1);

  // Multiple instances of the identical descriptor is ignored.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f1, f2, never_set_field});

  // Fields should be swapped (just once).
  EXPECT_TRUE(m1_.has_oneof_uint32());
  EXPECT_TRUE(m2_.has_oneof_string());
  EXPECT_TRUE(r1_->HasField(m1_, f1));
  EXPECT_TRUE(r2_->HasField(m2_, f2));
  EXPECT_EQ(m1_.oneof_uint32(), 1);
  EXPECT_EQ(m2_.oneof_string(), "test");

  // Calling oneof accessors on a swapped-out field will give the default value.
  EXPECT_FALSE(m1_.has_oneof_string());
  EXPECT_FALSE(m2_.has_oneof_uint32());
  EXPECT_FALSE(r1_->HasField(m1_, d1_->FindFieldByName("oneof_string")));
  EXPECT_FALSE(r2_->HasField(m2_, d2_->FindFieldByName("oneof_uint32")));
  EXPECT_THAT(m1_.oneof_string(), IsEmpty());
  EXPECT_EQ(m2_.oneof_uint32(), 0);
}